

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_limit_req_module.c
# Opt level: O0

void ngx_http_limit_req_expire(ngx_http_limit_req_ctx_t *ctx,ngx_uint_t n)

{
  ngx_queue_t *pnVar1;
  ngx_msec_t nVar2;
  long local_50;
  ngx_http_limit_req_node_t *lr;
  ngx_rbtree_node_t *node;
  ngx_msec_int_t ms;
  ngx_queue_t *q;
  ngx_msec_t now;
  ngx_int_t excess;
  ngx_uint_t n_local;
  ngx_http_limit_req_ctx_t *ctx_local;
  
  nVar2 = ngx_current_msec;
  excess = n;
  do {
    if (((2 < (ulong)excess) || (&ctx->sh->queue == (ctx->sh->queue).prev)) ||
       (pnVar1 = (ctx->sh->queue).prev, pnVar1[2].prev != (ngx_queue_t *)0x0)) {
      return;
    }
    if (excess != 0) {
      local_50 = nVar2 - (long)pnVar1[1].prev;
      if (local_50 < 0) {
        local_50 = -local_50;
      }
      if (local_50 < 60000) {
        return;
      }
      if (0 < (long)((long)pnVar1[1].next - (ctx->rate * local_50) / 1000)) {
        return;
      }
    }
    pnVar1->next->prev = pnVar1->prev;
    pnVar1->prev->next = pnVar1->next;
    pnVar1->prev = (ngx_queue_t *)0x0;
    pnVar1->next = (ngx_queue_t *)0x0;
    ngx_rbtree_delete(&ctx->sh->rbtree,(ngx_rbtree_node_t *)&pnVar1[-3].next);
    ngx_slab_free_locked(ctx->shpool,&pnVar1[-3].next);
    excess = excess + 1;
  } while( true );
}

Assistant:

static void
ngx_http_limit_req_expire(ngx_http_limit_req_ctx_t *ctx, ngx_uint_t n)
{
    ngx_int_t                   excess;
    ngx_msec_t                  now;
    ngx_queue_t                *q;
    ngx_msec_int_t              ms;
    ngx_rbtree_node_t          *node;
    ngx_http_limit_req_node_t  *lr;

    now = ngx_current_msec;

    /*
     * n == 1 deletes one or two zero rate entries
     * n == 0 deletes oldest entry by force
     *        and one or two zero rate entries
     */

    while (n < 3) {

        if (ngx_queue_empty(&ctx->sh->queue)) {
            return;
        }

        q = ngx_queue_last(&ctx->sh->queue);

        lr = ngx_queue_data(q, ngx_http_limit_req_node_t, queue);

        if (lr->count) {

            /*
             * There is not much sense in looking further,
             * because we bump nodes on the lookup stage.
             */

            return;
        }

        if (n++ != 0) {

            ms = (ngx_msec_int_t) (now - lr->last);
            ms = ngx_abs(ms);

            if (ms < 60000) {
                return;
            }

            excess = lr->excess - ctx->rate * ms / 1000;

            if (excess > 0) {
                return;
            }
        }

        ngx_queue_remove(q);

        node = (ngx_rbtree_node_t *)
                   ((u_char *) lr - offsetof(ngx_rbtree_node_t, color));

        ngx_rbtree_delete(&ctx->sh->rbtree, node);

        ngx_slab_free_locked(ctx->shpool, node);
    }
}